

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_disk_io.cpp
# Opt level: O0

void __thiscall
libtorrent::disabled_disk_io::async_read
          (disabled_disk_io *this,storage_index_t param_1,peer_request *r,
          function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)>
          *handler,disk_job_flags_t param_4)

{
  io_context *ctx;
  type local_50;
  function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)> *local_28;
  function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)> *handler_local;
  peer_request *r_local;
  disabled_disk_io *this_local;
  disk_job_flags_t param_5_local;
  storage_index_t param_2_local;
  
  ctx = this->m_ios;
  local_50.this = this;
  local_28 = handler;
  handler_local =
       (function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)> *)r;
  r_local = (peer_request *)this;
  this_local._3_1_ = param_4.m_val;
  this_local._4_4_ = param_1.m_val;
  ::std::function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)>::
  function(&local_50.h,handler);
  boost::asio::
  post<boost::asio::io_context,libtorrent::disabled_disk_io::async_read(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::peer_request_const&,std::function<void(libtorrent::disk_buffer_holder,libtorrent::storage_error_const&)>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_job_flags_tag,void>)::_lambda()_1_>
            (ctx,&local_50,(type *)0x0);
  async_read(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::peer_request_const&,std::function<void(libtorrent::disk_buffer_holder,libtorrent::storage_error_const&)>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_job_flags_tag,void>)
  ::{lambda()#1}::~bitfield_flag((_lambda___1_ *)&local_50);
  return;
}

Assistant:

void async_read(storage_index_t, peer_request const& r
		, std::function<void(disk_buffer_holder, storage_error const&)> handler
		, disk_job_flags_t) override
	{
		TORRENT_ASSERT(r.length <= default_block_size);
		TORRENT_UNUSED(r);

		post(m_ios, [this, h = std::move(handler)] {
			h(disk_buffer_holder(*this, this->m_zero_buffer.get(), default_block_size)
				, storage_error{});
		});
	}